

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::logAnalysis
          (RenderCountCase *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          *samples)

{
  TestLog *this_00;
  size_type __n;
  Sample *pSVar1;
  const_reference pvVar2;
  reference pvVar3;
  MessageBuilder *pMVar4;
  int precision;
  string local_9b0;
  MessageBuilder local_990;
  allocator<char> local_809;
  string local_808;
  MessageBuilder local_7e8;
  allocator<char> local_661;
  string local_660;
  MessageBuilder local_640;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  LogSection local_470;
  MessageBuilder local_430;
  MessageBuilder local_2b0;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  LogSection local_e0;
  float local_a0;
  float local_9c;
  float mpxPerS;
  float pxPerUs;
  float pxPerCall;
  float usPerCall;
  LineParametersWithConfidence testParam;
  float confidence;
  Sample *sample;
  size_t ndx;
  allocator<tcu::Vector<float,_2>_> local_41;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> testSamples;
  int maxWorkload;
  TestLog *log;
  vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  *samples_local;
  RenderCountCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  testSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  __n = std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
        ::size(samples);
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_41);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40,__n,
             &local_41);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_41);
  for (sample = (Sample *)0x0;
      pSVar1 = (Sample *)
               std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
               ::size(samples), sample < pSVar1; sample = (Sample *)((long)&sample->nullTime + 1)) {
    pvVar2 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
             ::operator[](samples,(size_type)sample);
    tcu::Vector<float,_2>::Vector
              ((Vector<float,_2> *)&testParam.confidence,(float)pvVar2->workload,
               (float)pvVar2->testTime);
    pvVar3 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_40,(size_type)sample);
    *(undefined8 *)pvVar3->m_data = stack0xffffffffffffff90;
    testSamples.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         de::max<int>(testSamples.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,pvVar2->workload);
  }
  testParam.coefficientConfidenceLower = 0.6;
  deqp::gls::theilSenSiegelLinearRegression
            ((LineParametersWithConfidence *)&pxPerCall,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40,0.6)
  ;
  pxPerUs = testParam.offsetConfidenceUpper;
  mpxPerS = 262144.0;
  local_a0 = 262144.0 / testParam.offsetConfidenceUpper;
  local_9c = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Linear Regression",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"Linear Regression",&local_129);
  tcu::LogSection::LogSection(&local_e0,&local_100,&local_128);
  tcu::TestLog::operator<<(this_00,&local_e0);
  tcu::LogSection::~LogSection(&local_e0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  tcu::TestLog::operator<<(&local_2b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_2b0,
                      (char (*) [143])
                      "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is "
                     );
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&testParam.coefficientConfidenceLower);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2b0);
  tcu::TestLog::operator<<(&local_430,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_430,(char (*) [44])"Render time for scene with depth test was\n\t");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c316fc);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&testParam.offset);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pxPerCall);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&usPerCall);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])"]us +");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c316fc);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&testParam.coefficient);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&testParam.offsetConfidenceUpper);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&testParam.offsetConfidenceLower);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])"us/workload");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_430);
  tcu::TestLog::operator<<(this_00,(EndSectionToken *)&tcu::TestLog::EndSection);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"Result",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"Result",&local_4b9);
  tcu::LogSection::LogSection(&local_470,&local_490,&local_4b8);
  tcu::TestLog::operator<<(this_00,&local_470);
  tcu::LogSection::~LogSection(&local_470);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  if (0.0 <= testParam.coefficient) {
    if (testParam.offsetConfidenceLower * 0.25 <= testParam.coefficient) {
      tcu::TestLog::operator<<(&local_990,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_990,(char (*) [24])"Culled hidden pixels @ ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_a0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [6])"Mpx/s");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_990);
      de::floatToString_abi_cxx11_(&local_9b0,(de *)0x2,local_a0,precision);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,&local_9b0);
      std::__cxx11::string::~string((string *)&local_9b0);
    }
    else {
      tcu::TestLog::operator<<(&local_7e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_7e8,
                          (char (*) [77])
                          "Coefficient confidence range is extremely large, cannot give reliable result"
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"Result confidence extremely low",&local_809);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,&local_808);
      std::__cxx11::string::~string((string *)&local_808);
      std::allocator<char>::~allocator(&local_809);
    }
  }
  else {
    tcu::TestLog::operator<<(&local_640,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_640,
                        (char (*) [105])
                        "Coefficient confidence bounds include values below 0.0, the operation likely has neglible per-pixel cost"
                       );
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_640);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"Pass",&local_661);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator(&local_661);
  }
  tcu::TestLog::operator<<(this_00,(EndSectionToken *)&tcu::TestLog::EndSection);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40);
  return;
}

Assistant:

void RenderCountCase::logAnalysis (const vector<Sample>& samples)
{
	using namespace gls;

	TestLog&		log			= m_testCtx.getLog();
	int				maxWorkload	= 0;
	vector<Vec2>	testSamples	(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
	{
		const Sample& sample = samples[ndx];

		testSamples[ndx] = Vec2((float)sample.workload, (float)sample.testTime);

		maxWorkload = de::max(maxWorkload, sample.workload);
	}

	{
		const float							confidence	= 0.60f;
		const LineParametersWithConfidence	testParam	= theilSenSiegelLinearRegression(testSamples, confidence);
		const float							usPerCall	= testParam.coefficient;
		const float							pxPerCall	= RENDER_SIZE*RENDER_SIZE;
		const float							pxPerUs		= pxPerCall/usPerCall;
		const float							mpxPerS		= pxPerUs;

		log << TestLog::Section("Linear Regression", "Linear Regression");
		log << TestLog::Message << "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is " << confidence << TestLog::EndMessage;
		log << TestLog::Message << "Render time for scene with depth test was\n\t"
			<< "[" << testParam.offsetConfidenceLower << ", " << testParam.offset <<  ", " << testParam.offsetConfidenceUpper << "]us +"
			<< "[" << testParam.coefficientConfidenceLower << ", " << testParam.coefficient << ", " << testParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;
		log << TestLog::EndSection;

		log << TestLog::Section("Result", "Result");

		if (testParam.coefficientConfidenceLower < 0.0f)
		{
			log << TestLog::Message << "Coefficient confidence bounds include values below 0.0, the operation likely has neglible per-pixel cost" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else if (testParam.coefficientConfidenceLower < testParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else
		{
			log << TestLog::Message << "Culled hidden pixels @ " << mpxPerS << "Mpx/s" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, de::floatToString(mpxPerS, 2));
		}

		log << TestLog::EndSection;
	}
}